

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

int __thiscall
CVmConsole::read_event_script
          (CVmConsole *this,int *evt,char *buf,size_t buflen,int *filter,int filter_cnt,
          unsigned_long *attrs)

{
  FILE *__stream;
  undefined2 uVar1;
  int iVar2;
  uint uVar3;
  script_stack_entry *psVar4;
  ulong uVar5;
  CVmConsole *this_00;
  
  psVar4 = this->script_sp_;
  if ((psVar4 != (script_stack_entry *)0x0) && (psVar4->event_script != 0)) {
    do {
      __stream = (FILE *)psVar4->fp;
      this_00 = this;
      iVar2 = read_script_event_type(this,evt,attrs);
      if (iVar2 != 0) {
        if (filter == (int *)0x0) {
LAB_002416cc:
          if (buf == (char *)0x0) {
            do {
              do {
                iVar2 = fgetc(__stream);
              } while (0xe < iVar2 + 1U);
            } while ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) == 0);
            return 1;
          }
          iVar2 = read_script_param(this_00,buf,buflen,(osfildef *)__stream);
          if (iVar2 != 0) {
            if (*evt != 1) {
              return 1;
            }
            iVar2 = strcmp(buf,"[enter]");
            if (iVar2 == 0) {
              uVar1 = 10;
            }
            else {
              iVar2 = strcmp(buf,"[tab]");
              if (iVar2 == 0) {
                uVar1 = 9;
              }
              else {
                iVar2 = strcmp(buf,"[space]");
                if (iVar2 != 0) {
                  return 1;
                }
                uVar1 = 0x20;
              }
            }
            *(undefined2 *)buf = uVar1;
            return 1;
          }
          return 0;
        }
        do {
          if (0 < filter_cnt) {
            uVar5 = 0;
            do {
              if (filter[uVar5] == *evt) goto LAB_002416cc;
              uVar5 = uVar5 + 1;
            } while ((uint)filter_cnt != uVar5);
          }
          do {
            do {
              iVar2 = fgetc(__stream);
            } while (0xe < iVar2 + 1U);
          } while ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) == 0);
          this_00 = this;
          iVar2 = read_script_event_type(this,evt,attrs);
        } while (iVar2 != 0);
      }
      uVar3 = close_script_file(this);
      (*this->_vptr_CVmConsole[4])(this,(ulong)uVar3);
      psVar4 = this->script_sp_;
    } while (psVar4 != (script_stack_entry *)0x0);
  }
  return 0;
}

Assistant:

int CVmConsole::read_event_script(VMG_ int *evt, char *buf, size_t buflen,
                                  const int *filter, int filter_cnt,
                                  unsigned long *attrs)
{
    /* 
     *   if we're not reading a script, or it's not an event script, skip
     *   this 
     */
    if (script_sp_ == 0 || !script_sp_->event_script)
        return FALSE;

    /* get the script file */
    osfildef *fp = script_sp_->fp;

    /* keep going until we find something */
    for (;;)
    {
        /* read the next event */
        if (!read_script_event_type(evt, attrs))
        {
            /* end of the script - close it */
            set_more_state(close_script_file(vmg0_));

            /* if there's no more script file, there's no event */
            if (script_sp_ == 0)
                return FALSE;

            /* go back for the next event */
            fp = script_sp_->fp;
            continue;
        }

        /* if it's not in the filter list, skip it */
        if (filter != 0)
        {
            int i, found;

            /* look for a match in our filter list */
            for (i = 0, found = FALSE ; i < filter_cnt ; ++i)
            {
                if (filter[i] == *evt)
                {
                    found = TRUE;
                    break;
                }
            }

            /* if we didn't find it, skip this line */
            if (!found)
            {
                skip_script_line(fp);
                continue;
            }
        }

        /* if there's a buffer, read the rest of the line */
        if (buf != 0)
        {
            /* read the parameter into the buffer, and return the result */
            if (!read_script_param(buf, buflen, fp))
                return FALSE;

            /* if this is an OS_EVT_KEY event, translate special keys */
            if (*evt == OS_EVT_KEY)
            {
                if (strcmp(buf, "[enter]") == 0)
                    strcpy(buf, "\n");
                else if (strcmp(buf, "[tab]") == 0)
                    strcpy(buf, "\t");
                else if (strcmp(buf, "[space]") == 0)
                    strcpy(buf, " ");
            }
        }
        else
        {
            /* no result buffer - just skip anything left on the line */
            skip_script_line(fp);
        }

        /* success */
        return TRUE;
    }
}